

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  undefined1 local_48 [8];
  TraceInfo trace;
  
  trace.line = 0;
  trace._12_4_ = 0;
  trace.message.c_str_ = (char *)0x0;
  local_48 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  Message::GetString((Message *)&trace.message.length_);
  String::operator=((String *)&trace.line,(String *)&trace.message.length_);
  String::~String((String *)&trace.message.length_);
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,(TraceInfo *)local_48);
  String::~String((String *)&trace.line);
  return;
}

Assistant:

ScopedTrace::ScopedTrace(const char* file, int line, const Message& message) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}